

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O0

void __thiscall CMU462::PathTracer::update_screen(PathTracer *this)

{
  ulong uVar1;
  ulong uVar2;
  reference pvVar3;
  undefined4 *in_RDI;
  PathTracer *in_stack_00000200;
  
  switch(*in_RDI) {
  case 0:
  case 1:
    break;
  case 2:
    visualize_accel(in_stack_00000200);
    break;
  case 3:
    uVar1 = *(ulong *)(in_RDI + 0x2e);
    uVar2 = *(ulong *)(in_RDI + 0x30);
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x32),0);
    glDrawPixels(uVar1 & 0xffffffff,uVar2 & 0xffffffff,0x1908,0x1401,pvVar3);
    break;
  case 4:
    uVar1 = *(ulong *)(in_RDI + 0x2e);
    uVar2 = *(ulong *)(in_RDI + 0x30);
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x32),0);
    glDrawPixels(uVar1 & 0xffffffff,uVar2 & 0xffffffff,0x1908,0x1401,pvVar3);
  }
  return;
}

Assistant:

void PathTracer::update_screen() {
  switch (state) {
    case INIT:
    case READY:
      break;
    case VISUALIZE:
      visualize_accel();
      break;
    case RENDERING:
      glDrawPixels(frameBuffer.w, frameBuffer.h, GL_RGBA, GL_UNSIGNED_BYTE,
                   &frameBuffer.data[0]);
      break;
    case DONE:
      // sampleBuffer.tonemap(frameBuffer, tm_gamma, tm_level, tm_key, tm_wht);
      glDrawPixels(frameBuffer.w, frameBuffer.h, GL_RGBA, GL_UNSIGNED_BYTE,
                   &frameBuffer.data[0]);
      break;
  }
}